

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlListSort(void)

{
  int iVar1;
  int iVar2;
  xmlListPtr val;
  int local_1c;
  int n_l;
  xmlListPtr l;
  int mem_base;
  int test_ret;
  
  l._4_4_ = 0;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlListPtr(local_1c,0);
    xmlListSort(val);
    call_tests = call_tests + 1;
    des_xmlListPtr(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListSort",(ulong)(uint)(iVar2 - iVar1));
      l._4_4_ = l._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return l._4_4_;
}

Assistant:

static int
test_xmlListSort(void) {
    int test_ret = 0;

    int mem_base;
    xmlListPtr l; /* a list */
    int n_l;

    for (n_l = 0;n_l < gen_nb_xmlListPtr;n_l++) {
        mem_base = xmlMemBlocks();
        l = gen_xmlListPtr(n_l, 0);

        xmlListSort(l);
        call_tests++;
        des_xmlListPtr(n_l, l, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlListSort",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_l);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}